

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *time)

{
  size_t sStack_40;
  uchar tag;
  size_t year_len;
  size_t len;
  mbedtls_x509_time *pmStack_28;
  int ret;
  mbedtls_x509_time *time_local;
  uchar *end_local;
  uchar **p_local;
  
  if ((long)end - (long)*p < 1) {
    p_local._4_4_ = -0x2460;
  }
  else {
    if (**p == '\x17') {
      sStack_40 = 2;
    }
    else {
      if (**p != '\x18') {
        return -0x2462;
      }
      sStack_40 = 4;
    }
    *p = *p + 1;
    pmStack_28 = time;
    time_local = (mbedtls_x509_time *)end;
    end_local = (uchar *)p;
    len._4_4_ = mbedtls_asn1_get_len(p,end,&year_len);
    if (len._4_4_ == 0) {
      p_local._4_4_ = x509_parse_time((uchar **)end_local,year_len,sStack_40,pmStack_28);
    }
    else {
      p_local._4_4_ = len._4_4_ + -0x2400;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                   mbedtls_x509_time *time )
{
    int ret;
    size_t len, year_len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
        year_len = 2;
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
        year_len = 4;
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    (*p)++;
    ret = mbedtls_asn1_get_len( p, end, &len );

    if( ret != 0 )
        return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

    return x509_parse_time( p, len, year_len, time );
}